

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O2

void __thiscall
cmExportBuildFileGenerator::ComplainAboutMissingTarget
          (cmExportBuildFileGenerator *this,cmGeneratorTarget *depender,cmGeneratorTarget *dependee,
          int occurrences)

{
  cmake *this_00;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  ostringstream *this_01;
  char *pcVar4;
  undefined1 auStack_1d8 [16];
  string local_1c8;
  ostringstream e;
  
  bVar1 = cmSystemTools::GetErrorOccuredFlag();
  if (!bVar1) {
    this_01 = (ostringstream *)&e;
    std::__cxx11::ostringstream::ostringstream(this_01);
    poVar2 = std::operator<<((ostream *)this_01,"export called with target \"");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(depender);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    poVar2 = std::operator<<(poVar2,"\" which requires target \"");
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(dependee);
    poVar2 = std::operator<<(poVar2,(string *)psVar3);
    std::operator<<(poVar2,"\" ");
    if (occurrences == 0) {
      pcVar4 = "that is not in the export set.\n";
    }
    else {
      poVar2 = std::operator<<((ostream *)&e,"that is not in this export set, but ");
      this_01 = (ostringstream *)std::ostream::operator<<(poVar2,occurrences);
      pcVar4 = " times in others.\n";
    }
    std::operator<<((ostream *)this_01,pcVar4);
    poVar2 = std::operator<<((ostream *)&e,
                             "If the required target is not easy to reference in this call, ");
    std::operator<<(poVar2,"consider using the APPEND option with multiple separate calls.");
    this_00 = this->LG->GlobalGenerator->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmMakefile::GetBacktrace((cmMakefile *)auStack_1d8);
    cmake::IssueMessage(this_00,FATAL_ERROR,(string *)(auStack_1d8 + 0x10),
                        (cmListFileBacktrace *)auStack_1d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_1d8 + 8));
    std::__cxx11::string::~string((string *)(auStack_1d8 + 0x10));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return;
}

Assistant:

void cmExportBuildFileGenerator::ComplainAboutMissingTarget(
  cmGeneratorTarget* depender, cmGeneratorTarget* dependee, int occurrences)
{
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return;
  }

  std::ostringstream e;
  e << "export called with target \"" << depender->GetName()
    << "\" which requires target \"" << dependee->GetName() << "\" ";
  if (occurrences == 0) {
    e << "that is not in the export set.\n";
  } else {
    e << "that is not in this export set, but " << occurrences
      << " times in others.\n";
  }
  e << "If the required target is not easy to reference in this call, "
    << "consider using the APPEND option with multiple separate calls.";

  this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR, e.str(),
    this->LG->GetMakefile()->GetBacktrace());
}